

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void curve_getrect(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                  t_float basey,int *xp1,int *yp1,int *xp2,int *yp2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  t_pd f;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  t_float tVar10;
  
  iVar5 = *(int *)&z[0xd].g_next;
  tVar10 = fielddesc_getfloat((_fielddesc *)(z + 0xb),template,data,0);
  if ((tVar10 != 0.0) || (NAN(tVar10))) {
    if ((glist->field_0xe8 & 0x20) == 0) {
      uVar1 = *(uint *)&z[3].g_pd & 4;
    }
    else {
      uVar1 = *(uint *)&z[3].g_pd & 8;
    }
    if (uVar1 == 0) {
      f = z[0xe].g_pd;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      iVar3 = -0x7fffffff;
      iVar4 = 0x7fffffff;
      iVar7 = 0x7fffffff;
      iVar6 = -0x7fffffff;
      while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
        tVar10 = fielddesc_getcoord((_fielddesc *)f,template,data,0);
        tVar10 = glist_xtopixels(glist,tVar10 + basex);
        iVar8 = (int)tVar10;
        tVar10 = fielddesc_getcoord((_fielddesc *)&f->c_nmethod,template,data,0);
        tVar10 = glist_ytopixels(glist,tVar10 + basey);
        iVar2 = (int)tVar10;
        if (iVar8 <= iVar4) {
          iVar4 = iVar8;
        }
        if (iVar3 <= iVar8) {
          iVar3 = iVar8;
        }
        if (iVar2 <= iVar7) {
          iVar7 = iVar2;
        }
        if (iVar6 <= iVar2) {
          iVar6 = iVar2;
        }
        f = (t_pd)&f->c_symbolmethod;
      }
      *xp1 = iVar4;
      *yp1 = iVar7;
      *xp2 = iVar3;
      *yp2 = iVar6;
      return;
    }
  }
  *yp1 = 0x7fffffff;
  *xp1 = 0x7fffffff;
  *yp2 = -0x7fffffff;
  *xp2 = -0x7fffffff;
  return;
}

Assistant:

static void curve_getrect(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    t_fielddesc *f = x->x_vec;
    int x1 = 0x7fffffff, x2 = -0x7fffffff, y1 = 0x7fffffff, y2 = -0x7fffffff;
    if (!fielddesc_getfloat(&x->x_vis, template, data, 0) ||
        (glist->gl_edit && x->x_flags & NOMOUSEEDIT) ||
        (!glist->gl_edit && x->x_flags & NOMOUSERUN))
    {
        *xp1 = *yp1 = 0x7fffffff;
        *xp2 = *yp2 = -0x7fffffff;
        return;
    }
    for (i = 0, f = x->x_vec; i < n; i++, f += 2)
    {
        int xloc = glist_xtopixels(glist,
            basex + fielddesc_getcoord(f, template, data, 0));
        int yloc = glist_ytopixels(glist,
            basey + fielddesc_getcoord(f+1, template, data, 0));
        if (xloc < x1) x1 = xloc;
        if (xloc > x2) x2 = xloc;
        if (yloc < y1) y1 = yloc;
        if (yloc > y2) y2 = yloc;
    }
    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}